

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIComboBox::openCloseMenu(CGUIComboBox *this)

{
  IGUIListBox *pIVar1;
  IGUIElement *this_00;
  pointer pSVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  char cVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  IGUIFont *pIVar9;
  int extraout_var;
  CGUIListBox *this_01;
  long lVar10;
  int iVar11;
  s32 i;
  int iVar12;
  long lVar13;
  SEvent event;
  
  if (this->ListBox == (IGUIListBox *)0x0) {
    if (*(long **)&this->field_0x20 != (long *)0x0) {
      event.EventType = EET_GUI_EVENT;
      event.field_1.GUIEvent.Element = (IGUIElement *)0x0;
      event.field_1.GUIEvent.EventType = EGET_LISTBOX_OPENED;
      event.field_1.GUIEvent.Caller = (IGUIElement *)this;
      cVar5 = (**(code **)(**(long **)&this->field_0x20 + 0x10))();
      if (cVar5 != '\0') {
        return;
      }
      (**(code **)(**(long **)&this->field_0x20 + 0xd0))(*(long **)&this->field_0x20,this);
    }
    plVar8 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    uVar7 = (uint)(((long)(this->Items).m_data.
                          super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->Items).m_data.
                         super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    uVar6 = (**(code **)(*(long *)this + 0x180))(this);
    if (uVar6 < uVar7) {
      uVar7 = (**(code **)(*(long *)this + 0x180))(this);
    }
    iVar11 = uVar7 + (uVar7 == 0);
    pIVar9 = (IGUIFont *)(**(code **)(*plVar8 + 0x30))(plVar8,0);
    this->ActiveFont = pIVar9;
    if (pIVar9 != (IGUIFont *)0x0) {
      (*pIVar9->_vptr_IGUIFont[1])(pIVar9,L"A");
      iVar11 = (extraout_var + 4) * iVar11;
    }
    iVar12 = *(int *)&this->field_0x4c - *(int *)&this->field_0x44;
    auVar4._8_4_ = iVar11 + iVar12;
    auVar4._4_4_ = *(int *)&this->field_0x48 - *(int *)&this->field_0x40;
    this_01 = (CGUIListBox *)operator_new(0x1d0);
    auVar4._0_4_ = iVar12;
    auVar4._12_4_ = 0;
    CGUIListBox::CGUIListBox
              (this_01,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
               (rect<int>)(auVar4 << 0x20),false,true,true);
    this->ListBox = (IGUIListBox *)this_01;
    (**(code **)(*(long *)this_01 + 0x88))(this_01,1);
    pIVar1 = this->ListBox;
    (pIVar1->super_IGUIElement).NoClip = true;
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[3])();
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
               + (long)(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
                       [-3]));
    iVar11 = (this->ListBox->super_IGUIElement).AbsoluteRect.LowerRightCorner.Y;
    lVar10 = (**(code **)(**(long **)&this->field_0x128 + 0xb0))();
    if (*(int *)(lVar10 + 0x4c) - *(int *)(lVar10 + 0x44) < iVar11) {
      this_00 = &this->ListBox->super_IGUIElement;
      event._4_4_ = (this_00->AbsoluteRect).UpperLeftCorner.Y -
                    (this_00->AbsoluteRect).LowerRightCorner.Y;
      event.EventType = EET_GUI_EVENT;
      event.field_1.MouseInput.Y = 0;
      event.field_1.MouseInput.X = *(int *)&this->field_0x48 - *(int *)&this->field_0x40;
      IGUIElement::setRelativePosition(this_00,(rect<int> *)&event);
    }
    lVar10 = 0;
    lVar13 = 0;
    while( true ) {
      pIVar1 = this->ListBox;
      pSVar2 = (this->Items).m_data.
               super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pp_Var3 = (pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver;
      if ((int)(((long)(this->Items).m_data.
                       super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x28) <= lVar13)
      break;
      (*pp_Var3[0x26])(pIVar1,*(undefined8 *)((long)&(pSVar2->Name).str._M_dataplus._M_p + lVar10));
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 0x28;
    }
    (*pp_Var3[0x2e])(pIVar1,(ulong)(uint)this->Selected);
    (**(code **)(**(long **)&this->field_0x128 + 8))(*(long **)&this->field_0x128,this->ListBox);
  }
  else {
    (**(code **)(**(long **)&this->field_0x128 + 8))(*(long **)&this->field_0x128,this);
    (*(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[9])();
    this->ListBox = (IGUIListBox *)0x0;
  }
  return;
}

Assistant:

void CGUIComboBox::openCloseMenu()
{
	if (ListBox) {
		// close list box
		Environment->setFocus(this);
		ListBox->remove();
		ListBox = nullptr;
	} else {
		if (Parent) {
			SEvent event;
			event.EventType = EET_GUI_EVENT;
			event.GUIEvent.Caller = this;
			event.GUIEvent.Element = nullptr;
			event.GUIEvent.EventType = EGET_LISTBOX_OPENED;

			// Allow to prevent the listbox from opening.
			if (Parent->OnEvent(event))
				return;

			Parent->bringToFront(this);
		}

		IGUISkin *skin = Environment->getSkin();
		u32 h = Items.size();

		if (h > getMaxSelectionRows())
			h = getMaxSelectionRows();
		if (h == 0)
			h = 1;

		ActiveFont = skin->getFont();
		if (ActiveFont)
			h *= (ActiveFont->getDimension(L"A").Height + 4);

		// open list box
		core::rect<s32> r(0, AbsoluteRect.getHeight(),
				AbsoluteRect.getWidth(), AbsoluteRect.getHeight() + h);

		ListBox = new CGUIListBox(Environment, this, -1, r, false, true, true);
		ListBox->setSubElement(true);
		ListBox->setNotClipped(true);
		ListBox->drop();

		// ensure that list box is always completely visible
		if (ListBox->getAbsolutePosition().LowerRightCorner.Y > Environment->getRootGUIElement()->getAbsolutePosition().getHeight())
			ListBox->setRelativePosition(core::rect<s32>(0, -ListBox->getAbsolutePosition().getHeight(), AbsoluteRect.getWidth(), 0));

		for (s32 i = 0; i < (s32)Items.size(); ++i)
			ListBox->addItem(Items[i].Name.c_str());

		ListBox->setSelected(Selected);

		// set focus
		Environment->setFocus(ListBox);
	}
}